

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt.c
# Opt level: O2

_Bool s390_cpu_has_mcck_int(S390CPU *cpu)

{
  return false;
}

Assistant:

bool s390_cpu_has_mcck_int(S390CPU *cpu)
{
#if 0
    QEMUS390FLICState *flic = s390_get_qemu_flic(s390_get_flic());
    CPUS390XState *env = &cpu->env;

    if (!(env->psw.mask & PSW_MASK_MCHECK)) {
        return false;
    }

    /* for now we only support channel report machine checks (floating) */
    if (qemu_s390_flic_has_crw_mchk(flic) &&
        (env->cregs[14] & CR14_CHANNEL_REPORT_SC)) {
        return true;
    }
#endif

    return false;
}